

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O2

void av1_prune_ab_partitions
               (AV1_COMP *cpi,MACROBLOCK *x,PC_TREE *pc_tree,int pb_source_variance,
               int64_t best_rdcost,RD_RECT_PART_WIN_INFO *rect_part_win_info,
               _Bool ext_partition_allowed,PartitionSearchState *part_state,
               int *ab_partitions_allowed)

{
  ExtPartController *ext_part_controller;
  PARTITION_TYPE PVar1;
  BLOCK_SIZE BVar2;
  int iVar3;
  uint uVar4;
  _Bool _Var5;
  int i;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  float fVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  float fVar17;
  int in_stack_ffffffffffffd418;
  int sub_block_rdcost [8];
  float features [10];
  aom_partition_features_t features_1;
  float score [16];
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  
  uVar13 = 0;
  if (ext_partition_allowed) {
    uVar14 = 0;
    if ((cpi->oxcf).part_cfg.enable_ab_partitions == true) {
      uVar13 = (uint)(part_state->partition_rect_allowed[0] != 0);
      uVar14 = (uint)(part_state->partition_rect_allowed[1] != 0);
    }
  }
  else {
    uVar14 = 0;
  }
  iVar7 = (cpi->sf).part_sf.prune_ext_partition_types_search_level;
  if (iVar7 != 0) {
    uVar8 = 1;
    if (iVar7 == 1) {
      PVar1 = pc_tree->partitioning;
      if ((PVar1 == '\x01') ||
         ((uVar11 = 1, uVar6 = uVar11, 0x1f < pb_source_variance || PVar1 != '\0' &&
          (uVar8 = (uint)(PVar1 == '\x03'), uVar6 = uVar8, PVar1 != '\x02')))) {
        uVar6 = uVar8;
        uVar11 = (uint)(PVar1 == '\x03');
      }
    }
    else {
      PVar1 = pc_tree->partitioning;
      uVar6 = (uint)(PVar1 == '\x03');
      if (PVar1 == '\x01') {
        uVar6 = uVar8;
      }
      uVar11 = (uint)(PVar1 == '\x03');
      if (PVar1 == '\x02') {
        uVar11 = uVar8;
      }
    }
    uVar13 = uVar13 & uVar6;
    uVar14 = uVar14 & uVar11;
    lVar10 = part_state->rect_part_rd[0][0];
    lVar9 = 0;
    if (lVar10 == 0x7fffffffffffffff) {
      lVar10 = lVar9;
    }
    part_state->rect_part_rd[0][0] = lVar10;
    lVar10 = part_state->rect_part_rd[0][1];
    if (lVar10 == 0x7fffffffffffffff) {
      lVar10 = lVar9;
    }
    part_state->rect_part_rd[0][1] = lVar10;
    lVar10 = part_state->rect_part_rd[1][0];
    if (lVar10 == 0x7fffffffffffffff) {
      lVar10 = lVar9;
    }
    part_state->rect_part_rd[1][0] = lVar10;
    lVar10 = part_state->rect_part_rd[1][1];
    if (lVar10 == 0x7fffffffffffffff) {
      lVar10 = lVar9;
    }
    part_state->rect_part_rd[1][1] = lVar10;
    lVar10 = part_state->split_rd[0];
    if (part_state->split_rd[0] == 0x7fffffffffffffff) {
      lVar10 = lVar9;
    }
    lVar15 = part_state->split_rd[1];
    if (part_state->split_rd[1] == 0x7fffffffffffffff) {
      lVar15 = lVar9;
    }
    part_state->split_rd[0] = lVar10;
    part_state->split_rd[1] = lVar15;
    lVar10 = part_state->split_rd[2];
    if (part_state->split_rd[2] == 0x7fffffffffffffff) {
      lVar10 = lVar9;
    }
    part_state->split_rd[2] = lVar10;
    lVar10 = part_state->split_rd[3];
    if (part_state->split_rd[3] == 0x7fffffffffffffff) {
      lVar10 = lVar9;
    }
    part_state->split_rd[3] = lVar10;
  }
  *ab_partitions_allowed = uVar13;
  ab_partitions_allowed[1] = uVar13;
  iVar7 = (cpi->sf).part_sf.prune_ext_partition_types_search_level;
  uVar8 = uVar13;
  if (iVar7 != 0) {
    uVar16 = (ulong)(iVar7 == 1) ^ 0xf;
    uVar8 = 0;
    if ((long)(((part_state->split_rd[0] + part_state->rect_part_rd[0][1] + part_state->split_rd[1])
               / 0x10) * uVar16) < best_rdcost) {
      uVar8 = uVar13;
    }
    if (best_rdcost <=
        (long)(uVar16 * ((part_state->split_rd[2] + part_state->rect_part_rd[0][0] +
                         part_state->split_rd[3]) / 0x10))) {
      uVar13 = 0;
    }
    *ab_partitions_allowed = uVar8;
    ab_partitions_allowed[1] = uVar13;
  }
  ab_partitions_allowed[2] = uVar14;
  ab_partitions_allowed[3] = uVar14;
  iVar7 = (cpi->sf).part_sf.prune_ext_partition_types_search_level;
  uVar6 = uVar14;
  if (iVar7 != 0) {
    uVar16 = (ulong)(iVar7 == 1) ^ 0xf;
    uVar11 = 0;
    if ((long)(((part_state->split_rd[0] + part_state->rect_part_rd[1][1] + part_state->split_rd[2])
               / 0x10) * uVar16) < best_rdcost) {
      uVar11 = uVar14;
    }
    uVar6 = 0;
    if ((long)(uVar16 * ((part_state->split_rd[1] + part_state->rect_part_rd[1][0] +
                         part_state->split_rd[3]) / 0x10)) < best_rdcost) {
      uVar6 = uVar14;
    }
    ab_partitions_allowed[2] = uVar11;
    ab_partitions_allowed[3] = uVar6;
    uVar14 = uVar11;
  }
  if (((ext_partition_allowed && (cpi->sf).part_sf.ml_prune_partition != 0) &&
      (part_state->partition_rect_allowed[0] != 0)) && (part_state->partition_rect_allowed[1] != 0))
  {
    uVar11 = x->source_variance;
    uVar4 = 0x1f;
    if (uVar11 != 0) {
      for (; uVar11 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    iVar7 = (uVar4 ^ 0xffffffe0) + 0x21;
    if (uVar11 == 0) {
      iVar7 = 0;
    }
    BVar2 = (part_state->part_blk_params).bsize;
    if (((best_rdcost < 1000000000 && BLOCK_8X4 < BVar2) && (uVar11 = BVar2 - 6, (byte)uVar11 < 10))
       && ((0x249U >> (uVar11 & 0x1f) & 1) != 0)) {
      iVar3 = *(int *)(&DAT_004688f8 + (ulong)(uVar11 & 0xff) * 4);
      features[0] = (float)pc_tree->partitioning;
      features[1] = (float)iVar7;
      sub_block_rdcost[4] = 0;
      sub_block_rdcost[5] = 0;
      sub_block_rdcost[6] = 0;
      sub_block_rdcost[7] = 0;
      sub_block_rdcost[0] = 0;
      sub_block_rdcost[1] = 0;
      sub_block_rdcost[2] = 0;
      sub_block_rdcost[3] = 0;
      for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
        lVar9 = part_state->rect_part_rd[0][lVar10];
        if (lVar9 - 1U < 999999999) {
          sub_block_rdcost[lVar10] = (int)lVar9;
        }
      }
      for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
        lVar9 = part_state->rect_part_rd[1][lVar10];
        if (lVar9 - 1U < 999999999) {
          sub_block_rdcost[lVar10 + 2] = (int)lVar9;
        }
      }
      for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
        if (part_state->split_rd[lVar10] - 1U < 999999999) {
          sub_block_rdcost[lVar10 + 4] = (int)part_state->split_rd[lVar10];
        }
      }
      for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
        iVar7 = sub_block_rdcost[lVar10];
        if (iVar7 < (int)best_rdcost) {
          fVar17 = (float)iVar7 / (float)(int)best_rdcost;
        }
        else {
          fVar17 = 1.0;
        }
        if (iVar7 < 1) {
          fVar17 = 1.0;
        }
        features[lVar10 + 2] = fVar17;
      }
      if (((((cpi->common).current_frame.frame_type & 0xfd) != 0) &&
          (write_features_to_file
                     ((cpi->oxcf).partition_info_path,(cpi->ext_part_controller).test_mode != 0,
                      features,10,6,BLOCK_4X4,in_stack_ffffffffffffd418,(int)pc_tree),
          ((cpi->common).current_frame.frame_type & 0xfd) != 0)) &&
         (ext_part_controller = &cpi->ext_part_controller, ext_part_controller->ready != 0)) {
        features_1.id = AOM_EXT_PART_FEATURE_AFTER_RECT;
        for (lVar10 = 0; lVar10 != 10; lVar10 = lVar10 + 1) {
          features_1.after_part_rect.f[lVar10] = features[lVar10];
        }
        av1_ext_part_send_features(ext_part_controller,&features_1);
        _Var5 = av1_ext_part_get_partition_decision
                          (ext_part_controller,(aom_partition_decision_t *)score);
        if (_Var5) {
          *ab_partitions_allowed = local_4c;
          ab_partitions_allowed[1] = local_48;
          ab_partitions_allowed[2] = local_44;
          ab_partitions_allowed[3] = local_40;
          uVar8 = local_4c;
          uVar13 = local_48;
          uVar14 = local_44;
          uVar6 = local_40;
          goto LAB_002bcb4b;
        }
      }
      score[0xc] = 0.0;
      score[0xd] = 0.0;
      score[0xe] = 0.0;
      score[0xf] = 0.0;
      score[8] = 0.0;
      score[9] = 0.0;
      score[10] = 0.0;
      score[0xb] = 0.0;
      score[4] = 0.0;
      score[5] = 0.0;
      score[6] = 0.0;
      score[7] = 0.0;
      score[0] = 0.0;
      score[1] = 0.0;
      score[2] = 0.0;
      score[3] = 0.0;
      uVar11 = 1;
      (*av1_nn_predict)(features,(NN_CONFIG *)(&DAT_004688f8 + iVar3),1,score);
      fVar17 = -NAN;
      for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
        fVar12 = (float)(int)(score[lVar10] * 100.0);
        features_1.before_part_none.f[lVar10 + -1] = fVar12;
        if ((int)fVar17 <= (int)fVar12) {
          fVar17 = fVar12;
        }
      }
      if (BVar2 == BLOCK_16X16) {
        fVar17 = (float)((int)fVar17 + -0x96);
      }
      else if (BVar2 == BLOCK_32X32) {
        fVar17 = (float)((int)fVar17 + -100);
      }
      ab_partitions_allowed[0] = 0;
      ab_partitions_allowed[1] = 0;
      ab_partitions_allowed[2] = 0;
      ab_partitions_allowed[3] = 0;
      uVar6 = 0;
      uVar14 = 0;
      uVar13 = 0;
      uVar8 = 0;
      for (uVar16 = 0; uVar16 != 0x10; uVar16 = uVar16 + 1) {
        if ((int)fVar17 <= (int)features_1.before_part_none.f[uVar16 - 1]) {
          if ((uVar16 & 1) != 0) {
            *ab_partitions_allowed = 1;
            uVar8 = uVar11;
          }
          if ((uVar16 & 2) != 0) {
            ab_partitions_allowed[1] = 1;
            uVar13 = uVar11;
          }
          if ((uVar16 & 4) != 0) {
            ab_partitions_allowed[2] = 1;
            uVar14 = uVar11;
          }
          if (7 < uVar16) {
            ab_partitions_allowed[3] = 1;
            uVar6 = uVar11;
          }
        }
      }
    }
  }
LAB_002bcb4b:
  if (1 < (cpi->sf).part_sf.prune_ext_part_using_split_info) {
    if (uVar8 != 0) {
      uVar11 = evaluate_ab_partition_based_on_split(pc_tree,'\x01',rect_part_win_info,x->qindex,0,1)
      ;
      *ab_partitions_allowed = uVar11 & uVar8;
      if ((cpi->sf).part_sf.prune_ext_part_using_split_info < 2) {
        return;
      }
    }
    if (uVar13 != 0) {
      uVar8 = evaluate_ab_partition_based_on_split(pc_tree,'\x01',rect_part_win_info,x->qindex,2,3);
      ab_partitions_allowed[1] = uVar8 & uVar13;
      if ((cpi->sf).part_sf.prune_ext_part_using_split_info < 2) {
        return;
      }
    }
    if (uVar14 != 0) {
      uVar13 = evaluate_ab_partition_based_on_split(pc_tree,'\x02',rect_part_win_info,x->qindex,0,2)
      ;
      ab_partitions_allowed[2] = uVar13 & uVar14;
      if ((cpi->sf).part_sf.prune_ext_part_using_split_info < 2) {
        return;
      }
    }
    if (uVar6 != 0) {
      uVar13 = evaluate_ab_partition_based_on_split(pc_tree,'\x02',rect_part_win_info,x->qindex,1,3)
      ;
      ab_partitions_allowed[3] = uVar13 & uVar6;
    }
  }
  return;
}

Assistant:

void av1_prune_ab_partitions(AV1_COMP *cpi, const MACROBLOCK *x,
                             const PC_TREE *pc_tree, int pb_source_variance,
                             int64_t best_rdcost,
                             const RD_RECT_PART_WIN_INFO *rect_part_win_info,
                             bool ext_partition_allowed,
                             PartitionSearchState *part_state,
                             int *ab_partitions_allowed) {
  int64_t *horz_rd = part_state->rect_part_rd[HORZ];
  int64_t *vert_rd = part_state->rect_part_rd[VERT];
  int64_t *split_rd = part_state->split_rd;
  const PartitionCfg *const part_cfg = &cpi->oxcf.part_cfg;
  // The standard AB partitions are allowed initially if ext-partition-types are
  // allowed.
  int horzab_partition_allowed = ext_partition_allowed &&
                                 part_cfg->enable_ab_partitions &&
                                 part_state->partition_rect_allowed[HORZ];
  int vertab_partition_allowed = ext_partition_allowed &&
                                 part_cfg->enable_ab_partitions &&
                                 part_state->partition_rect_allowed[VERT];

  // Pruning: pruning out AB partitions on one main direction based on the
  // current best partition and source variance.
  if (cpi->sf.part_sf.prune_ext_partition_types_search_level) {
    if (cpi->sf.part_sf.prune_ext_partition_types_search_level == 1) {
      // TODO(debargha,huisu@google.com): may need to tune the threshold for
      // pb_source_variance.
      horzab_partition_allowed &= (pc_tree->partitioning == PARTITION_HORZ ||
                                   (pc_tree->partitioning == PARTITION_NONE &&
                                    pb_source_variance < 32) ||
                                   pc_tree->partitioning == PARTITION_SPLIT);
      vertab_partition_allowed &= (pc_tree->partitioning == PARTITION_VERT ||
                                   (pc_tree->partitioning == PARTITION_NONE &&
                                    pb_source_variance < 32) ||
                                   pc_tree->partitioning == PARTITION_SPLIT);
    } else {
      horzab_partition_allowed &= (pc_tree->partitioning == PARTITION_HORZ ||
                                   pc_tree->partitioning == PARTITION_SPLIT);
      vertab_partition_allowed &= (pc_tree->partitioning == PARTITION_VERT ||
                                   pc_tree->partitioning == PARTITION_SPLIT);
    }
    horz_rd[0] = (horz_rd[0] < INT64_MAX ? horz_rd[0] : 0);
    horz_rd[1] = (horz_rd[1] < INT64_MAX ? horz_rd[1] : 0);
    vert_rd[0] = (vert_rd[0] < INT64_MAX ? vert_rd[0] : 0);
    vert_rd[1] = (vert_rd[1] < INT64_MAX ? vert_rd[1] : 0);
    split_rd[0] = (split_rd[0] < INT64_MAX ? split_rd[0] : 0);
    split_rd[1] = (split_rd[1] < INT64_MAX ? split_rd[1] : 0);
    split_rd[2] = (split_rd[2] < INT64_MAX ? split_rd[2] : 0);
    split_rd[3] = (split_rd[3] < INT64_MAX ? split_rd[3] : 0);
  }

  // Pruning: pruning out horz_a or horz_b if the combined rdcost of its
  // subblocks estimated from previous partitions is much higher than the best
  // rd so far.
  ab_partitions_allowed[HORZ_A] = horzab_partition_allowed;
  ab_partitions_allowed[HORZ_B] = horzab_partition_allowed;
  if (cpi->sf.part_sf.prune_ext_partition_types_search_level) {
    const int64_t horz_a_rd = horz_rd[1] + split_rd[0] + split_rd[1];
    const int64_t horz_b_rd = horz_rd[0] + split_rd[2] + split_rd[3];
    switch (cpi->sf.part_sf.prune_ext_partition_types_search_level) {
      case 1:
        ab_partitions_allowed[HORZ_A] &= (horz_a_rd / 16 * 14 < best_rdcost);
        ab_partitions_allowed[HORZ_B] &= (horz_b_rd / 16 * 14 < best_rdcost);
        break;
      case 2:
      default:
        ab_partitions_allowed[HORZ_A] &= (horz_a_rd / 16 * 15 < best_rdcost);
        ab_partitions_allowed[HORZ_B] &= (horz_b_rd / 16 * 15 < best_rdcost);
        break;
    }
  }

  // Pruning: pruning out vert_a or vert_b if the combined rdcost of its
  // subblocks estimated from previous partitions is much higher than the best
  // rd so far.
  ab_partitions_allowed[VERT_A] = vertab_partition_allowed;
  ab_partitions_allowed[VERT_B] = vertab_partition_allowed;
  if (cpi->sf.part_sf.prune_ext_partition_types_search_level) {
    const int64_t vert_a_rd = vert_rd[1] + split_rd[0] + split_rd[2];
    const int64_t vert_b_rd = vert_rd[0] + split_rd[1] + split_rd[3];
    switch (cpi->sf.part_sf.prune_ext_partition_types_search_level) {
      case 1:
        ab_partitions_allowed[VERT_A] &= (vert_a_rd / 16 * 14 < best_rdcost);
        ab_partitions_allowed[VERT_B] &= (vert_b_rd / 16 * 14 < best_rdcost);
        break;
      case 2:
      default:
        ab_partitions_allowed[VERT_A] &= (vert_a_rd / 16 * 15 < best_rdcost);
        ab_partitions_allowed[VERT_B] &= (vert_b_rd / 16 * 15 < best_rdcost);
        break;
    }
  }

  // Pruning: pruning out some ab partitions using a DNN taking rd costs of
  // sub-blocks from previous basic partition types.
  if (cpi->sf.part_sf.ml_prune_partition && ext_partition_allowed &&
      part_state->partition_rect_allowed[HORZ] &&
      part_state->partition_rect_allowed[VERT]) {
    // TODO(huisu@google.com): x->source_variance may not be the current
    // block's variance. The correct one to use is pb_source_variance. Need to
    // re-train the model to fix it.
    ml_prune_ab_partition(cpi, pc_tree->partitioning,
                          get_unsigned_bits(x->source_variance), best_rdcost,
                          part_state, ab_partitions_allowed);
  }

  // Pruning: pruning AB partitions based on the number of horz/vert wins
  // in the current block and sub-blocks in PARTITION_SPLIT.
  if (cpi->sf.part_sf.prune_ext_part_using_split_info >= 2 &&
      ab_partitions_allowed[HORZ_A]) {
    ab_partitions_allowed[HORZ_A] &= evaluate_ab_partition_based_on_split(
        pc_tree, PARTITION_HORZ, rect_part_win_info, x->qindex, 0, 1);
  }
  if (cpi->sf.part_sf.prune_ext_part_using_split_info >= 2 &&
      ab_partitions_allowed[HORZ_B]) {
    ab_partitions_allowed[HORZ_B] &= evaluate_ab_partition_based_on_split(
        pc_tree, PARTITION_HORZ, rect_part_win_info, x->qindex, 2, 3);
  }
  if (cpi->sf.part_sf.prune_ext_part_using_split_info >= 2 &&
      ab_partitions_allowed[VERT_A]) {
    ab_partitions_allowed[VERT_A] &= evaluate_ab_partition_based_on_split(
        pc_tree, PARTITION_VERT, rect_part_win_info, x->qindex, 0, 2);
  }
  if (cpi->sf.part_sf.prune_ext_part_using_split_info >= 2 &&
      ab_partitions_allowed[VERT_B]) {
    ab_partitions_allowed[VERT_B] &= evaluate_ab_partition_based_on_split(
        pc_tree, PARTITION_VERT, rect_part_win_info, x->qindex, 1, 3);
  }
}